

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatoko.c
# Opt level: O2

void Gia_ManSatokoReport(int iOutput,int status,abctime clk)

{
  char *pcVar1;
  abctime time;
  char *format;
  
  if (iOutput < 0) {
    Abc_Print(iOutput,"Total: ");
  }
  else {
    Abc_Print(iOutput,"Output %6d : ",(ulong)(uint)iOutput);
  }
  pcVar1 = "UNSATISFIABLE  ";
  if (status == 1) {
    pcVar1 = "SATISFIABLE    ";
  }
  format = "UNDECIDED      ";
  if (status != 0) {
    format = pcVar1;
  }
  Abc_Print(iOutput,format);
  Abc_PrintTime(0x816bba,(char *)clk,time);
  return;
}

Assistant:

void Gia_ManSatokoReport( int iOutput, int status, abctime clk )
{
    if ( iOutput >= 0 )
        Abc_Print( 1, "Output %6d : ", iOutput );
    else
        Abc_Print( 1, "Total: " );

    if ( status == SATOKO_UNDEC )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( status == SATOKO_SAT )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );

    Abc_PrintTime( 1, "Time", clk );
}